

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall CRegexParser::ensure_range_buf_space(CRegexParser *this)

{
  size_t sVar1;
  wchar_t *pwVar2;
  
  if (this->range_buf_ == (wchar_t *)0x0) {
    this->range_buf_max_ = 0x80;
    pwVar2 = (wchar_t *)malloc(0x200);
    this->range_buf_ = pwVar2;
    this->range_buf_cnt_ = 0;
  }
  else {
    sVar1 = this->range_buf_cnt_;
    if (sVar1 != this->range_buf_max_) {
      return;
    }
    this->range_buf_max_ = sVar1 + 0x80;
    pwVar2 = (wchar_t *)realloc(this->range_buf_,sVar1 * 4 + 0x200);
    this->range_buf_ = pwVar2;
  }
  if (pwVar2 != (wchar_t *)0x0) {
    return;
  }
  err_throw(0xca);
}

Assistant:

void CRegexParser::ensure_range_buf_space()
{
    /* make sure we have room for another entry */
    if (range_buf_ == 0)
    {
        /* 
         *   allocate an initial size - it must be even, since we always
         *   consume elements in pairs 
         */
        range_buf_max_ = 128;
        range_buf_ = (wchar_t *)t3malloc(range_buf_max_ * sizeof(wchar_t));

        /* no entries yet */
        range_buf_cnt_ = 0;
    }
    else if (range_buf_cnt_ == range_buf_max_)
    {
        /* 
         *   reallocate the buffer at a larger size (the size must always be
         *   even, since we always add to the buffer in pairs) 
         */
        range_buf_max_ += 128;
        range_buf_ = (wchar_t *)t3realloc(range_buf_,
                                          range_buf_max_ * sizeof(wchar_t));
    }

    /* if the range buffer is null, throw an error */
    if (range_buf_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);
}